

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

size_t Unit::fromText(string *text)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  double size_00;
  double size;
  char *unit_ptr;
  char *ptr;
  string *text_local;
  
  ptr = (char *)text;
  unit_ptr = (char *)std::__cxx11::string::c_str();
  size_00 = strtod(unit_ptr,(char **)&size);
  lVar1 = (long)size - (long)unit_ptr;
  lVar2 = std::__cxx11::string::size();
  if (lVar1 == lVar2) {
    error("No unit specified");
  }
  else {
    if (*(char *)size == 'B') {
      sVar3 = B<double>(size_00);
      return sVar3;
    }
    if (*(char *)size == 'K') {
      sVar3 = KiB<double>(size_00);
      return sVar3;
    }
    if (*(char *)size == 'M') {
      sVar3 = MiB<double>(size_00);
      return sVar3;
    }
    if (*(char *)size == 'G') {
      sVar3 = GiB<double>(size_00);
      return sVar3;
    }
  }
  error("Failed to parse size (format: {num}{B/KiB/MiB/GiB}, e.g. 8GiB)");
  return 0;
}

Assistant:

static size_t fromText(const std::string &text) {
        const char *ptr = text.c_str();
        char *unit_ptr;
        double size = strtod(ptr, &unit_ptr);
        if (unit_ptr - ptr == text.size()) {
           error("No unit specified");
        } else if (*unit_ptr == 'B') {
            return B(size);
        } else if (*unit_ptr == 'K') {
            return KiB(size);
        } else if (*unit_ptr == 'M') {
            return MiB(size);
        } else if (*unit_ptr == 'G') {
            return GiB(size);
        }
        error("Failed to parse size (format: {num}{B/KiB/MiB/GiB}, e.g. 8GiB)");
        return 0;
    }